

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::as_node(JSONNode *this)

{
  internalJSONNode *piVar1;
  JSONNode *res;
  long *in_RSI;
  
  piVar1 = (internalJSONNode *)*in_RSI;
  if (piVar1->_type == '\x04') {
    duplicate(this);
    this->internal->_type = '\x05';
  }
  else if (piVar1->_type == '\x05') {
    piVar1->refcount = piVar1->refcount + 1;
    this->internal = piVar1;
  }
  else {
    JSONNode(this,'\x05');
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_node(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_NODE){
		  return *this;
	   } else if (type() == JSON_ARRAY){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_NODE;
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_NODE);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_NODE);
    }